

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::removeEdge(Graph *this,int src_idx,int dst_idx)

{
  Node *pNVar1;
  iterator __position;
  iterator __position_00;
  Node *dst_exist;
  Node *src_exist;
  Node *local_30;
  Node *local_28;
  
  pNVar1 = getNode(this,src_idx);
  local_28 = pNVar1;
  local_30 = getNode(this,dst_idx);
  if (local_30 == (Node *)0x0 || pNVar1 == (Node *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n");
    return;
  }
  __position = std::
               _Rb_tree<Node_*,_std::pair<Node_*const,_int>,_std::_Select1st<std::pair<Node_*const,_int>_>,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>
               ::find(&(pNVar1->edges)._M_t,&local_30);
  __position_00 =
       std::
       _Rb_tree<Node_*,_std::pair<Node_*const,_int>,_std::_Select1st<std::pair<Node_*const,_int>_>,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>
       ::find(&(local_30->edges)._M_t,&local_28);
  if (((_Rb_tree_header *)__position._M_node !=
       &(local_28->edges)._M_t._M_impl.super__Rb_tree_header) &&
     ((_Rb_tree_header *)__position_00._M_node !=
      &(local_30->edges)._M_t._M_impl.super__Rb_tree_header)) {
    std::
    _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                        *)&local_28->edges,__position);
    std::
    _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                        *)&local_30->edges,__position_00);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n");
  exit(0);
}

Assistant:

void Graph::removeEdge(int src_idx, int dst_idx) {
    auto src_exist = getNode(src_idx);
    auto dst_exist = getNode(dst_idx);

    if(src_exist && dst_exist) {
        auto it1 = src_exist->edges.find(dst_exist);
        auto it2 = dst_exist->edges.find(src_exist);

        if(it1 != src_exist->edges.end() and
            it2 != dst_exist->edges.end()) {
            src_exist->edges.erase(it1);
            dst_exist->edges.erase(it2);
        } else {
            std::cerr << "Index not found. Couldn't remove edge\n";
            exit(0);
        }
    } else {
        std::cerr << "Index not found. Couldn't remove edge\n";
        //exit(0);
    }
}